

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O1

Command * __thiscall
anon_unknown.dwarf_287390::CAPIBuildSystemFrontendDelegate::chooseCommandFromMultipleProducers
          (CAPIBuildSystemFrontendDelegate *this,Node *outputNode,
          vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
          *commands)

{
  pointer pcVar1;
  pointer ppCVar2;
  StringRef str_00;
  CAPIBuildKey *this_00;
  Command *pCVar3;
  string str;
  llb_build_key_t *output;
  char *local_60;
  size_t local_58;
  char local_50;
  undefined7 uStack_4f;
  BuildKey local_40;
  
  if ((this->cAPIDelegate).choose_command_from_multiple_producers ==
      (_func_llb_buildsystem_command_t_ptr_void_ptr_llb_build_key_t_ptr_ptr_llb_buildsystem_command_t_ptr_ptr_uint64_t
       *)0x0) {
    pCVar3 = (Command *)0x0;
  }
  else {
    pcVar1 = (outputNode->name)._M_dataplus._M_p;
    if (pcVar1 == (pointer)0x0) {
      local_60 = &local_50;
      local_58 = 0;
      local_50 = '\0';
    }
    else {
      local_60 = &local_50;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,pcVar1,pcVar1 + (outputNode->name)._M_string_length);
    }
    this_00 = (CAPIBuildKey *)operator_new(0x38);
    str_00.Length = local_58;
    str_00.Data = local_60;
    llbuild::buildsystem::BuildKey::BuildKey(&local_40,'N',str_00);
    CAPIBuildKey::CAPIBuildKey(this_00,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40.key.key._M_dataplus._M_p != &local_40.key.key.field_2) {
      operator_delete(local_40.key.key._M_dataplus._M_p,
                      local_40.key.key.field_2._M_allocated_capacity + 1);
    }
    ppCVar2 = (commands->
              super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_40.key.key._M_dataplus._M_p = (pointer)this_00;
    pCVar3 = (Command *)
             (*(this->cAPIDelegate).choose_command_from_multiple_producers)
                       ((this->cAPIDelegate).context,(llb_build_key_t **)&local_40,
                        (llb_buildsystem_command_t **)ppCVar2,
                        (long)(commands->
                              super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar2 >> 3);
    llb_build_key_destroy((llb_build_key_t *)local_40.key.key._M_dataplus._M_p);
    if (local_60 != &local_50) {
      operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
    }
  }
  return pCVar3;
}

Assistant:

virtual Command* chooseCommandFromMultipleProducers(Node* outputNode,
                   std::vector<Command*> commands) override {
    if (cAPIDelegate.choose_command_from_multiple_producers) {
      auto str = outputNode->getName().str();
      auto output = (llb_build_key_t *)new CAPIBuildKey(BuildKey::makeNode(str));

      llb_buildsystem_command_t* command = cAPIDelegate.choose_command_from_multiple_producers(
        cAPIDelegate.context,
        &output,
        (llb_buildsystem_command_t**)commands.data(),
        commands.size()
      );

      llb_build_key_destroy(output);

      return (Command*)command;
    } else {
      return nullptr;
    }
  }